

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  int iVar1;
  char *res;
  char *local_88;
  char *local_78;
  char *local_68;
  char *local_58;
  char *local_48;
  char *local_38;
  char *local_28;
  char *local_18;
  char *local_8;
  
  iVar1 = strcmp("A","A");
  if (iVar1 == 0) {
    local_8 = "B";
  }
  else {
    iVar1 = strcmp("A","alks;jdflaksd");
    if (iVar1 == 0) {
      local_8 = "ijqwj8f908qje098fjasjdfad";
    }
    else {
      iVar1 = strcmp("A","jjjj");
      if (iVar1 == 0) {
        local_8 = "jaisodjpfoaisjdpfspjoiajsd";
      }
      else {
        iVar1 = strcmp("A","lajpsoidjfpaoisjdf9a8098j");
        if (iVar1 == 0) {
          local_8 = "kaj;slkdjfp48j098jasoidjfasdad";
        }
        else {
          iVar1 = strcmp("A","japisd");
          if (iVar1 == 0) {
            local_8 = "0./askjfdap9isdf";
          }
          else {
            iVar1 = strcmp("A","aj8s9fasdf");
            if (iVar1 == 0) {
              local_8 = "akjsdpjaisdf";
            }
            else {
              iVar1 = strcmp("A","akjsdpofaids");
              if (iVar1 == 0) {
                local_8 = "984uuajsdf";
              }
              else {
                iVar1 = strcmp("A","90asdifasdfjads9ifja98sjdfa");
                if (iVar1 == 0) {
                  local_8 = "9iujfalksjdfaifjalkdsjfajsf489g";
                }
                else {
                  local_8 = (char *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  printf("%s",local_8);
  iVar1 = strcmp(local_8,"B");
  if (iVar1 != 0) {
    __assert_fail("strcmp(res, VALUE1) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/strcmp_opt/main.c"
                  ,0x41,"int main()");
  }
  iVar1 = strcmp("alks;jdflaksd","A");
  if (iVar1 == 0) {
    local_18 = "B";
  }
  else {
    iVar1 = strcmp("alks;jdflaksd","alks;jdflaksd");
    if (iVar1 == 0) {
      local_18 = "ijqwj8f908qje098fjasjdfad";
    }
    else {
      iVar1 = strcmp("alks;jdflaksd","jjjj");
      if (iVar1 == 0) {
        local_18 = "jaisodjpfoaisjdpfspjoiajsd";
      }
      else {
        iVar1 = strcmp("alks;jdflaksd","lajpsoidjfpaoisjdf9a8098j");
        if (iVar1 == 0) {
          local_18 = "kaj;slkdjfp48j098jasoidjfasdad";
        }
        else {
          iVar1 = strcmp("alks;jdflaksd","japisd");
          if (iVar1 == 0) {
            local_18 = "0./askjfdap9isdf";
          }
          else {
            iVar1 = strcmp("alks;jdflaksd","aj8s9fasdf");
            if (iVar1 == 0) {
              local_18 = "akjsdpjaisdf";
            }
            else {
              iVar1 = strcmp("alks;jdflaksd","akjsdpofaids");
              if (iVar1 == 0) {
                local_18 = "984uuajsdf";
              }
              else {
                iVar1 = strcmp("alks;jdflaksd","90asdifasdfjads9ifja98sjdfa");
                if (iVar1 == 0) {
                  local_18 = "9iujfalksjdfaifjalkdsjfajsf489g";
                }
                else {
                  local_18 = (char *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  printf("%s",local_18);
  iVar1 = strcmp(local_18,"ijqwj8f908qje098fjasjdfad");
  if (iVar1 != 0) {
    __assert_fail("strcmp(res, VALUE2) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/strcmp_opt/main.c"
                  ,0x45,"int main()");
  }
  iVar1 = strcmp("jjjj","A");
  if (iVar1 == 0) {
    local_28 = "B";
  }
  else {
    iVar1 = strcmp("jjjj","alks;jdflaksd");
    if (iVar1 == 0) {
      local_28 = "ijqwj8f908qje098fjasjdfad";
    }
    else {
      iVar1 = strcmp("jjjj","jjjj");
      if (iVar1 == 0) {
        local_28 = "jaisodjpfoaisjdpfspjoiajsd";
      }
      else {
        iVar1 = strcmp("jjjj","lajpsoidjfpaoisjdf9a8098j");
        if (iVar1 == 0) {
          local_28 = "kaj;slkdjfp48j098jasoidjfasdad";
        }
        else {
          iVar1 = strcmp("jjjj","japisd");
          if (iVar1 == 0) {
            local_28 = "0./askjfdap9isdf";
          }
          else {
            iVar1 = strcmp("jjjj","aj8s9fasdf");
            if (iVar1 == 0) {
              local_28 = "akjsdpjaisdf";
            }
            else {
              iVar1 = strcmp("jjjj","akjsdpofaids");
              if (iVar1 == 0) {
                local_28 = "984uuajsdf";
              }
              else {
                iVar1 = strcmp("jjjj","90asdifasdfjads9ifja98sjdfa");
                if (iVar1 == 0) {
                  local_28 = "9iujfalksjdfaifjalkdsjfajsf489g";
                }
                else {
                  local_28 = (char *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  printf("%s",local_28);
  iVar1 = strcmp(local_28,"jaisodjpfoaisjdpfspjoiajsd");
  if (iVar1 != 0) {
    __assert_fail("strcmp(res, VALUE3) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/strcmp_opt/main.c"
                  ,0x49,"int main()");
  }
  iVar1 = strcmp("lajpsoidjfpaoisjdf9a8098j","A");
  if (iVar1 == 0) {
    local_38 = "B";
  }
  else {
    iVar1 = strcmp("lajpsoidjfpaoisjdf9a8098j","alks;jdflaksd");
    if (iVar1 == 0) {
      local_38 = "ijqwj8f908qje098fjasjdfad";
    }
    else {
      iVar1 = strcmp("lajpsoidjfpaoisjdf9a8098j","jjjj");
      if (iVar1 == 0) {
        local_38 = "jaisodjpfoaisjdpfspjoiajsd";
      }
      else {
        iVar1 = strcmp("lajpsoidjfpaoisjdf9a8098j","lajpsoidjfpaoisjdf9a8098j");
        if (iVar1 == 0) {
          local_38 = "kaj;slkdjfp48j098jasoidjfasdad";
        }
        else {
          iVar1 = strcmp("lajpsoidjfpaoisjdf9a8098j","japisd");
          if (iVar1 == 0) {
            local_38 = "0./askjfdap9isdf";
          }
          else {
            iVar1 = strcmp("lajpsoidjfpaoisjdf9a8098j","aj8s9fasdf");
            if (iVar1 == 0) {
              local_38 = "akjsdpjaisdf";
            }
            else {
              iVar1 = strcmp("lajpsoidjfpaoisjdf9a8098j","akjsdpofaids");
              if (iVar1 == 0) {
                local_38 = "984uuajsdf";
              }
              else {
                iVar1 = strcmp("lajpsoidjfpaoisjdf9a8098j","90asdifasdfjads9ifja98sjdfa");
                if (iVar1 == 0) {
                  local_38 = "9iujfalksjdfaifjalkdsjfajsf489g";
                }
                else {
                  local_38 = (char *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  printf("%s",local_38);
  iVar1 = strcmp(local_38,"kaj;slkdjfp48j098jasoidjfasdad");
  if (iVar1 != 0) {
    __assert_fail("strcmp(res, VALUE4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/strcmp_opt/main.c"
                  ,0x4d,"int main()");
  }
  iVar1 = strcmp("japisd","A");
  if (iVar1 == 0) {
    local_48 = "B";
  }
  else {
    iVar1 = strcmp("japisd","alks;jdflaksd");
    if (iVar1 == 0) {
      local_48 = "ijqwj8f908qje098fjasjdfad";
    }
    else {
      iVar1 = strcmp("japisd","jjjj");
      if (iVar1 == 0) {
        local_48 = "jaisodjpfoaisjdpfspjoiajsd";
      }
      else {
        iVar1 = strcmp("japisd","lajpsoidjfpaoisjdf9a8098j");
        if (iVar1 == 0) {
          local_48 = "kaj;slkdjfp48j098jasoidjfasdad";
        }
        else {
          iVar1 = strcmp("japisd","japisd");
          if (iVar1 == 0) {
            local_48 = "0./askjfdap9isdf";
          }
          else {
            iVar1 = strcmp("japisd","aj8s9fasdf");
            if (iVar1 == 0) {
              local_48 = "akjsdpjaisdf";
            }
            else {
              iVar1 = strcmp("japisd","akjsdpofaids");
              if (iVar1 == 0) {
                local_48 = "984uuajsdf";
              }
              else {
                iVar1 = strcmp("japisd","90asdifasdfjads9ifja98sjdfa");
                if (iVar1 == 0) {
                  local_48 = "9iujfalksjdfaifjalkdsjfajsf489g";
                }
                else {
                  local_48 = (char *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  printf("%s",local_48);
  iVar1 = strcmp(local_48,"0./askjfdap9isdf");
  if (iVar1 == 0) {
    iVar1 = strcmp("aj8s9fasdf","A");
    if (iVar1 == 0) {
      local_58 = "B";
    }
    else {
      iVar1 = strcmp("aj8s9fasdf","alks;jdflaksd");
      if (iVar1 == 0) {
        local_58 = "ijqwj8f908qje098fjasjdfad";
      }
      else {
        iVar1 = strcmp("aj8s9fasdf","jjjj");
        if (iVar1 == 0) {
          local_58 = "jaisodjpfoaisjdpfspjoiajsd";
        }
        else {
          iVar1 = strcmp("aj8s9fasdf","lajpsoidjfpaoisjdf9a8098j");
          if (iVar1 == 0) {
            local_58 = "kaj;slkdjfp48j098jasoidjfasdad";
          }
          else {
            iVar1 = strcmp("aj8s9fasdf","japisd");
            if (iVar1 == 0) {
              local_58 = "0./askjfdap9isdf";
            }
            else {
              iVar1 = strcmp("aj8s9fasdf","aj8s9fasdf");
              if (iVar1 == 0) {
                local_58 = "akjsdpjaisdf";
              }
              else {
                iVar1 = strcmp("aj8s9fasdf","akjsdpofaids");
                if (iVar1 == 0) {
                  local_58 = "984uuajsdf";
                }
                else {
                  iVar1 = strcmp("aj8s9fasdf","90asdifasdfjads9ifja98sjdfa");
                  if (iVar1 == 0) {
                    local_58 = "9iujfalksjdfaifjalkdsjfajsf489g";
                  }
                  else {
                    local_58 = (char *)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
    printf("%s",local_58);
    iVar1 = strcmp(local_58,"akjsdpjaisdf");
    if (iVar1 != 0) {
      __assert_fail("strcmp(res, VALUE6) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/strcmp_opt/main.c"
                    ,0x55,"int main()");
    }
    iVar1 = strcmp("akjsdpofaids","A");
    if (iVar1 == 0) {
      local_68 = "B";
    }
    else {
      iVar1 = strcmp("akjsdpofaids","alks;jdflaksd");
      if (iVar1 == 0) {
        local_68 = "ijqwj8f908qje098fjasjdfad";
      }
      else {
        iVar1 = strcmp("akjsdpofaids","jjjj");
        if (iVar1 == 0) {
          local_68 = "jaisodjpfoaisjdpfspjoiajsd";
        }
        else {
          iVar1 = strcmp("akjsdpofaids","lajpsoidjfpaoisjdf9a8098j");
          if (iVar1 == 0) {
            local_68 = "kaj;slkdjfp48j098jasoidjfasdad";
          }
          else {
            iVar1 = strcmp("akjsdpofaids","japisd");
            if (iVar1 == 0) {
              local_68 = "0./askjfdap9isdf";
            }
            else {
              iVar1 = strcmp("akjsdpofaids","aj8s9fasdf");
              if (iVar1 == 0) {
                local_68 = "akjsdpjaisdf";
              }
              else {
                iVar1 = strcmp("akjsdpofaids","akjsdpofaids");
                if (iVar1 == 0) {
                  local_68 = "984uuajsdf";
                }
                else {
                  iVar1 = strcmp("akjsdpofaids","90asdifasdfjads9ifja98sjdfa");
                  if (iVar1 == 0) {
                    local_68 = "9iujfalksjdfaifjalkdsjfajsf489g";
                  }
                  else {
                    local_68 = (char *)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
    printf("%s",local_68);
    iVar1 = strcmp(local_68,"984uuajsdf");
    if (iVar1 != 0) {
      __assert_fail("strcmp(res, VALUE7) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/strcmp_opt/main.c"
                    ,0x59,"int main()");
    }
    iVar1 = strcmp("90asdifasdfjads9ifja98sjdfa","A");
    if (iVar1 == 0) {
      local_78 = "B";
    }
    else {
      iVar1 = strcmp("90asdifasdfjads9ifja98sjdfa","alks;jdflaksd");
      if (iVar1 == 0) {
        local_78 = "ijqwj8f908qje098fjasjdfad";
      }
      else {
        iVar1 = strcmp("90asdifasdfjads9ifja98sjdfa","jjjj");
        if (iVar1 == 0) {
          local_78 = "jaisodjpfoaisjdpfspjoiajsd";
        }
        else {
          iVar1 = strcmp("90asdifasdfjads9ifja98sjdfa","lajpsoidjfpaoisjdf9a8098j");
          if (iVar1 == 0) {
            local_78 = "kaj;slkdjfp48j098jasoidjfasdad";
          }
          else {
            iVar1 = strcmp("90asdifasdfjads9ifja98sjdfa","japisd");
            if (iVar1 == 0) {
              local_78 = "0./askjfdap9isdf";
            }
            else {
              iVar1 = strcmp("90asdifasdfjads9ifja98sjdfa","aj8s9fasdf");
              if (iVar1 == 0) {
                local_78 = "akjsdpjaisdf";
              }
              else {
                iVar1 = strcmp("90asdifasdfjads9ifja98sjdfa","akjsdpofaids");
                if (iVar1 == 0) {
                  local_78 = "984uuajsdf";
                }
                else {
                  iVar1 = strcmp("90asdifasdfjads9ifja98sjdfa","90asdifasdfjads9ifja98sjdfa");
                  if (iVar1 == 0) {
                    local_78 = "9iujfalksjdfaifjalkdsjfajsf489g";
                  }
                  else {
                    local_78 = (char *)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
    printf("%s",local_78);
    iVar1 = strcmp(local_78,"9iujfalksjdfaifjalkdsjfajsf489g");
    if (iVar1 == 0) {
      iVar1 = strcmp("","A");
      if (iVar1 == 0) {
        local_88 = "B";
      }
      else {
        iVar1 = strcmp("","alks;jdflaksd");
        if (iVar1 == 0) {
          local_88 = "ijqwj8f908qje098fjasjdfad";
        }
        else {
          iVar1 = strcmp("","jjjj");
          if (iVar1 == 0) {
            local_88 = "jaisodjpfoaisjdpfspjoiajsd";
          }
          else {
            iVar1 = strcmp("","lajpsoidjfpaoisjdf9a8098j");
            if (iVar1 == 0) {
              local_88 = "kaj;slkdjfp48j098jasoidjfasdad";
            }
            else {
              iVar1 = strcmp("","japisd");
              if (iVar1 == 0) {
                local_88 = "0./askjfdap9isdf";
              }
              else {
                iVar1 = strcmp("","aj8s9fasdf");
                if (iVar1 == 0) {
                  local_88 = "akjsdpjaisdf";
                }
                else {
                  iVar1 = strcmp("","akjsdpofaids");
                  if (iVar1 == 0) {
                    local_88 = "984uuajsdf";
                  }
                  else {
                    iVar1 = strcmp("","90asdifasdfjads9ifja98sjdfa");
                    if (iVar1 == 0) {
                      local_88 = "9iujfalksjdfaifjalkdsjfajsf489g";
                    }
                    else {
                      local_88 = (char *)0x0;
                    }
                  }
                }
              }
            }
          }
        }
      }
      printf("%s",local_88);
      if (local_88 == (char *)0x0) {
        return 0;
      }
      __assert_fail("res == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/strcmp_opt/main.c"
                    ,0x61,"int main()");
    }
    __assert_fail("strcmp(res, VALUE8) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/strcmp_opt/main.c"
                  ,0x5d,"int main()");
  }
  __assert_fail("strcmp(res, VALUE5) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/strcmp_opt/main.c"
                ,0x51,"int main()");
}

Assistant:

int
main()
{
    const char *res;

    res = str_switch(KEY1);
    printf("%s", res);
    assert(strcmp(res, VALUE1) == 0);

    res = str_switch(KEY2);
    printf("%s", res);
    assert(strcmp(res, VALUE2) == 0);

    res = str_switch(KEY3);
    printf("%s", res);
    assert(strcmp(res, VALUE3) == 0);

    res = str_switch(KEY4);
    printf("%s", res);
    assert(strcmp(res, VALUE4) == 0);

    res = str_switch(KEY5);
    printf("%s", res);
    assert(strcmp(res, VALUE5) == 0);

    res = str_switch(KEY6);
    printf("%s", res);
    assert(strcmp(res, VALUE6) == 0);

    res = str_switch(KEY7);
    printf("%s", res);
    assert(strcmp(res, VALUE7) == 0);

    res = str_switch(KEY8);
    printf("%s", res);
    assert(strcmp(res, VALUE8) == 0);

    res = str_switch("");
    printf("%s", res);
    assert(res == NULL);

    return res != NULL;
}